

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

void __thiscall CorUnix::CSynchData::ResetOwnership(CSynchData *this)

{
  this->m_lOwnershipCount = 0;
  this->m_dwOwnerPid = 0;
  this->m_dwOwnerTid = 0;
  this->m_pOwnerThread = (CPalThread *)0x0;
  this->m_poolnOwnedObjectListNode = (OwnedObjectsListNode *)0x0;
  return;
}

Assistant:

void CSynchData::ResetOwnership()
    {
        VALIDATEOBJECT(this);
        
        m_lOwnershipCount          = 0;
        m_dwOwnerPid               = 0; 
        m_dwOwnerTid               = 0;
        m_pOwnerThread             = NULL;
        m_poolnOwnedObjectListNode = NULL;
    }